

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txreconciliation.cpp
# Opt level: O0

ReconciliationRegisterResult __thiscall
TxReconciliationTracker::Impl::RegisterPeer
          (Impl *this,NodeId peer_id,bool is_peer_inbound,uint32_t peer_recon_version,
          uint64_t remote_salt)

{
  ConstevalFormatString<2U> fmt;
  bool bVar1;
  iterator iVar2;
  uint *puVar3;
  byte in_DL;
  LogFlags in_RDI;
  long in_FS_OFFSET;
  Level in_stack_00000060;
  long *in_stack_00000070;
  bool *in_stack_00000078;
  uint32_t recon_version;
  uint64_t local_salt;
  iterator recon_state;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock13;
  uint256 full_salt;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  unordered_map<long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>_>
  *in_stack_fffffffffffffec0;
  TxReconciliationState *in_stack_fffffffffffffec8;
  TxReconciliationState *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  char *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_fffffffffffffef8;
  int source_line;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  ReconciliationRegisterResult RVar4;
  string_view in_stack_ffffffffffffff70;
  string_view in_stack_ffffffffffffff80;
  undefined1 local_41 [57];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_41[0] = (bool)(in_DL & 1);
  AssertLockNotHeldInline
            (&in_stack_fffffffffffffec8->m_we_initiate,(char *)in_stack_fffffffffffffec0,
             in_stack_fffffffffffffebc,(Mutex *)0x4e5bc5);
  MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_stack_fffffffffffffef8,
             (AnnotatedMixin<std::mutex> *)
             CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),in_stack_fffffffffffffee8
             ,(char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             in_stack_fffffffffffffedc,SUB41((uint)in_stack_fffffffffffffed8 >> 0x18,0));
  iVar2 = std::
          unordered_map<long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>_>
          ::find(in_stack_fffffffffffffec0,
                 (key_type *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  source_line = iVar2.
                super__Node_iterator_base<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_false>
                ._M_cur._4_4_;
  std::
  unordered_map<long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>_>
  ::end(in_stack_fffffffffffffec0);
  bVar1 = std::__detail::operator==
                    ((_Node_iterator_base<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_false>
                      *)in_stack_fffffffffffffec8,
                     (_Node_iterator_base<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_false>
                      *)in_stack_fffffffffffffec0);
  if (bVar1) {
    RVar4 = NOT_FOUND;
  }
  else {
    std::__detail::
    _Node_iterator<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_false,_false>
    ::operator->((_Node_iterator<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_false,_false>
                  *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    bVar1 = std::
            holds_alternative<(anonymous_namespace)::TxReconciliationState,unsigned_long,(anonymous_namespace)::TxReconciliationState>
                      ((variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState> *)
                       CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    if (bVar1) {
      RVar4 = ALREADY_REGISTERED;
    }
    else {
      std::__detail::
      _Node_iterator<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_false,_false>
      ::operator->((_Node_iterator<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_false,_false>
                    *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      std::get_if<unsigned_long,unsigned_long,(anonymous_namespace)::TxReconciliationState>
                ((variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState> *)
                 CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      puVar3 = std::min<unsigned_int>
                         ((uint *)in_stack_fffffffffffffec0,
                          (uint *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      if (*puVar3 == 0) {
        RVar4 = PROTOCOL_VIOLATION;
      }
      else {
        bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                                    Trace);
        if (bVar1) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                     &in_stack_fffffffffffffed0->m_we_initiate);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                     &in_stack_fffffffffffffed0->m_we_initiate);
          in_stack_fffffffffffffed0 = (TxReconciliationState *)local_41;
          in_stack_fffffffffffffec8 = (TxReconciliationState *)(local_41 + 1);
          in_stack_fffffffffffffec0 =
               (unordered_map<long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>_>
                *)0x0;
          in_stack_fffffffffffffeb8 = 1;
          fmt.fmt._4_4_ = in_stack_ffffffffffffff6c;
          fmt.fmt._0_4_ = in_stack_ffffffffffffff68;
          LogPrintFormatInternal<long,bool>
                    (in_stack_ffffffffffffff80,in_stack_ffffffffffffff70,source_line,in_RDI,
                     in_stack_00000060,fmt,in_stack_00000070,in_stack_00000078);
        }
        anon_unknown.dwarf_4d0ee7::ComputeSalt
                  ((uint64_t)in_stack_fffffffffffffee8,
                   CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
        base_blob<256U>::GetUint64
                  ((base_blob<256U> *)in_stack_fffffffffffffec8,
                   (int)((ulong)in_stack_fffffffffffffec0 >> 0x20));
        base_blob<256U>::GetUint64
                  ((base_blob<256U> *)in_stack_fffffffffffffec8,
                   (int)((ulong)in_stack_fffffffffffffec0 >> 0x20));
        anon_unknown.dwarf_4d0ee7::TxReconciliationState::TxReconciliationState
                  (in_stack_fffffffffffffec8,SUB81((ulong)in_stack_fffffffffffffec0 >> 0x38,0),
                   CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),0x4e5e77);
        std::__detail::
        _Node_iterator<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_false,_false>
        ::operator->((_Node_iterator<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_false,_false>
                      *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        std::variant<unsigned_long,(anonymous_namespace)::TxReconciliationState>::operator=
                  ((variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState> *)
                   CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                   in_stack_fffffffffffffed0);
        RVar4 = SUCCESS;
      }
    }
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return RVar4;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_txreconciliation_mutex)
    {
        AssertLockNotHeld(m_txreconciliation_mutex);
        LOCK(m_txreconciliation_mutex);
        auto recon_state = m_states.find(peer_id);

        if (recon_state == m_states.end()) return ReconciliationRegisterResult::NOT_FOUND;

        if (std::holds_alternative<TxReconciliationState>(recon_state->second)) {
            return ReconciliationRegisterResult::ALREADY_REGISTERED;
        }

        uint64_t local_salt = *std::get_if<uint64_t>(&recon_state->second);

        // If the peer supports the version which is lower than ours, we downgrade to the version
        // it supports. For now, this only guarantees that nodes with future reconciliation
        // versions have the choice of reconciling with this current version. However, they also
        // have the choice to refuse supporting reconciliations if the common version is not
        // satisfactory (e.g. too low).
        const uint32_t recon_version{std::min(peer_recon_version, m_recon_version)};
        // v1 is the lowest version, so suggesting something below must be a protocol violation.
        if (recon_version < 1) return ReconciliationRegisterResult::PROTOCOL_VIOLATION;

        LogPrintLevel(BCLog::TXRECONCILIATION, BCLog::Level::Debug, "Register peer=%d (inbound=%i)\n",
                      peer_id, is_peer_inbound);

        const uint256 full_salt{ComputeSalt(local_salt, remote_salt)};
        recon_state->second = TxReconciliationState(!is_peer_inbound, full_salt.GetUint64(0), full_salt.GetUint64(1));
        return ReconciliationRegisterResult::SUCCESS;
    }